

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pFVar3 = this->left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  dVar1 = (pFVar5->fadexpr_).left_.constant_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  dVar7 = sin((((FadBinaryMul<FadCst<double>,_Fad<double>_> *)((long)&(pFVar6->fadexpr_).expr_ + 8))
              ->left_).constant_ * (*(Fad<double> **)((long)&(pFVar6->fadexpr_).expr_ + 0x18))->val_
             );
  pFVar6 = (pFVar4->fadexpr_).right_;
  dVar8 = sin((pFVar6->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((pFVar6->fadexpr_).expr_.fadexpr_.right_)->val_);
  dVar2 = (pFVar3->fadexpr_).right_.constant_;
  dVar9 = sin((this->right_->fadexpr_).expr_.val_);
  return dVar9 * (dVar8 * dVar7 * dVar1 - dVar2);
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}